

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O0

unique_ptr<wasm_externtype_t,_std::default_delete<wasm_externtype_t>_> __thiscall
wasm_externtype_t::New
          (wasm_externtype_t *this,
          unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_> *ptr)

{
  pointer pEVar1;
  FuncType *args;
  TableType *args_00;
  MemoryType *args_01;
  GlobalType *args_02;
  unique_ptr<wasm_globaltype_t,_std::default_delete<wasm_globaltype_t>_> local_38;
  unique_ptr<wasm_memorytype_t,_std::default_delete<wasm_memorytype_t>_> local_30;
  unique_ptr<wasm_tabletype_t,_std::default_delete<wasm_tabletype_t>_> local_28;
  unique_ptr<wasm_functype_t,_std::default_delete<wasm_functype_t>_> local_20;
  unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_> *local_18;
  unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_> *ptr_local;
  
  local_18 = ptr;
  ptr_local = (unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
               *)this;
  pEVar1 = std::unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
           ::operator->(ptr);
  switch(pEVar1->kind) {
  case First:
    pEVar1 = std::
             unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>::
             get(ptr);
    args = wabt::cast<wabt::interp::FuncType,wabt::interp::ExternType>(pEVar1);
    wabt::MakeUnique<wasm_functype_t,wabt::interp::FuncType&>((wabt *)&local_20,args);
    std::unique_ptr<wasm_externtype_t,std::default_delete<wasm_externtype_t>>::
    unique_ptr<wasm_functype_t,std::default_delete<wasm_functype_t>,void>
              ((unique_ptr<wasm_externtype_t,std::default_delete<wasm_externtype_t>> *)this,
               &local_20);
    std::unique_ptr<wasm_functype_t,_std::default_delete<wasm_functype_t>_>::~unique_ptr(&local_20);
    break;
  case Table:
    pEVar1 = std::
             unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>::
             get(ptr);
    args_00 = wabt::cast<wabt::interp::TableType,wabt::interp::ExternType>(pEVar1);
    wabt::MakeUnique<wasm_tabletype_t,wabt::interp::TableType&>((wabt *)&local_28,args_00);
    std::unique_ptr<wasm_externtype_t,std::default_delete<wasm_externtype_t>>::
    unique_ptr<wasm_tabletype_t,std::default_delete<wasm_tabletype_t>,void>
              ((unique_ptr<wasm_externtype_t,std::default_delete<wasm_externtype_t>> *)this,
               &local_28);
    std::unique_ptr<wasm_tabletype_t,_std::default_delete<wasm_tabletype_t>_>::~unique_ptr
              (&local_28);
    break;
  case Memory:
    pEVar1 = std::
             unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>::
             get(ptr);
    args_01 = wabt::cast<wabt::interp::MemoryType,wabt::interp::ExternType>(pEVar1);
    wabt::MakeUnique<wasm_memorytype_t,wabt::interp::MemoryType&>((wabt *)&local_30,args_01);
    std::unique_ptr<wasm_externtype_t,std::default_delete<wasm_externtype_t>>::
    unique_ptr<wasm_memorytype_t,std::default_delete<wasm_memorytype_t>,void>
              ((unique_ptr<wasm_externtype_t,std::default_delete<wasm_externtype_t>> *)this,
               &local_30);
    std::unique_ptr<wasm_memorytype_t,_std::default_delete<wasm_memorytype_t>_>::~unique_ptr
              (&local_30);
    break;
  case Global:
    pEVar1 = std::
             unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>::
             get(ptr);
    args_02 = wabt::cast<wabt::interp::GlobalType,wabt::interp::ExternType>(pEVar1);
    wabt::MakeUnique<wasm_globaltype_t,wabt::interp::GlobalType&>((wabt *)&local_38,args_02);
    std::unique_ptr<wasm_externtype_t,std::default_delete<wasm_externtype_t>>::
    unique_ptr<wasm_globaltype_t,std::default_delete<wasm_globaltype_t>,void>
              ((unique_ptr<wasm_externtype_t,std::default_delete<wasm_externtype_t>> *)this,
               &local_38);
    std::unique_ptr<wasm_globaltype_t,_std::default_delete<wasm_globaltype_t>_>::~unique_ptr
              (&local_38);
    break;
  case Event:
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/interp/interp-wasm-c-api.cc"
                  ,0xc0,
                  "static std::unique_ptr<wasm_externtype_t> wasm_externtype_t::New(std::unique_ptr<ExternType>)"
                 );
  }
  return (__uniq_ptr_data<wasm_externtype_t,_std::default_delete<wasm_externtype_t>,_true,_true>)
         (__uniq_ptr_data<wasm_externtype_t,_std::default_delete<wasm_externtype_t>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<wasm_externtype_t> wasm_externtype_t::New(
    std::unique_ptr<ExternType> ptr) {
  switch (ptr->kind) {
    case ExternKind::Func:
      return MakeUnique<wasm_functype_t>(*cast<FuncType>(ptr.get()));

    case ExternKind::Table:
      return MakeUnique<wasm_tabletype_t>(*cast<TableType>(ptr.get()));

    case ExternKind::Memory:
      return MakeUnique<wasm_memorytype_t>(*cast<MemoryType>(ptr.get()));

    case ExternKind::Global:
      return MakeUnique<wasm_globaltype_t>(*cast<GlobalType>(ptr.get()));

    case ExternKind::Event:
      break;
  }

  assert(false);
  return {};
}